

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_galileo_rev_g.c
# Opt level: O2

mraa_result_t mraa_intel_galileo_g2_mmap_setup(mraa_gpio_context dev,mraa_boolean_t en)

{
  mraa_boolean_t mVar1;
  mraa_result_t mVar2;
  long lVar3;
  mraa_pin_t *pmVar4;
  int *piVar5;
  char *pcVar6;
  undefined1 *puVar7;
  byte bVar8;
  mraa_pin_t in_stack_ffffffffffffff18;
  int local_78 [26];
  
  bVar8 = 0;
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"Galileo mmap: context not valid");
    return MRAA_ERROR_INVALID_HANDLE;
  }
  mVar1 = mraa_pin_mode_test(dev->phy_pin,MRAA_PIN_FAST_GPIO);
  if (mVar1 == 0) {
    syslog(3,"Galileo mmap: mmap not on this pin");
    return MRAA_ERROR_NO_RESOURCES;
  }
  if (en == 0) {
    if (dev->mmap_write != (_func_mraa_result_t_mraa_gpio_context_int *)0x0) {
      dev->mmap_write = (_func_mraa_result_t_mraa_gpio_context_int *)0x0;
      mmap_count = mmap_count - 1;
      if (mmap_count != 0) {
        return MRAA_SUCCESS;
      }
      if (mmap_reg != (uint8_t *)0x0) {
        munmap(mmap_reg,0x1000);
        mmap_reg = (uint8_t *)0x0;
        close(mmap_fd);
        return MRAA_SUCCESS;
      }
      pcVar6 = "mmap: null register cant unsetup";
      goto LAB_00114eb7;
    }
    pcVar6 = "edison mmap: can\'t disable disabled mmap gpio";
  }
  else {
    if (dev->mmap_write == (_func_mraa_result_t_mraa_gpio_context_int *)0x0) {
      if (mmap_reg == (uint8_t *)0x0) {
        mmap_fd = open("/dev/uio0",2);
        if (mmap_fd < 0) {
          pcVar6 = "mmap: Unable to open UIO device";
          goto LAB_00114eb7;
        }
        mmap_reg = (uint8_t *)mmap((void *)0x0,0x1000,3,1,mmap_fd,0);
        if (mmap_reg == (uint8_t *)0xffffffffffffffff) {
          syslog(3,"mmap: failed to mmap");
          mmap_reg = (uint8_t *)0x0;
          close(mmap_fd);
          return MRAA_ERROR_NO_RESOURCES;
        }
      }
      pmVar4 = &plat->pins[dev->phy_pin].mmap.gpio;
      piVar5 = local_78;
      for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
        *piVar5 = pmVar4->pinmap;
        pmVar4 = (mraa_pin_t *)((long)pmVar4 + (ulong)bVar8 * -8 + 4);
        piVar5 = piVar5 + (ulong)bVar8 * -2 + 1;
      }
      piVar5 = local_78;
      puVar7 = &stack0xffffffffffffff18;
      for (lVar3 = 100; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar7 = (char)*piVar5;
        piVar5 = (int *)((long)piVar5 + (ulong)bVar8 * -2 + 1);
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
      mVar2 = mraa_setup_mux_mapped(in_stack_ffffffffffffff18);
      if (mVar2 == MRAA_SUCCESS) {
        dev->mmap_write = mraa_intel_galileo_g2_mmap_write;
        return MRAA_SUCCESS;
      }
      pcVar6 = "mmap: unable to setup required multiplexers";
LAB_00114eb7:
      syslog(3,pcVar6);
      return MRAA_ERROR_INVALID_RESOURCE;
    }
    pcVar6 = "edison mmap: can\'t enable enabled mmap gpio";
  }
  syslog(3,pcVar6 + 7);
  return MRAA_ERROR_INVALID_PARAMETER;
}

Assistant:

mraa_result_t
mraa_intel_galileo_g2_mmap_setup(mraa_gpio_context dev, mraa_boolean_t en)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "Galileo mmap: context not valid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (mraa_pin_mode_test(dev->phy_pin, MRAA_PIN_FAST_GPIO) == 0) {
        syslog(LOG_ERR, "Galileo mmap: mmap not on this pin");
        return MRAA_ERROR_NO_RESOURCES;
    }
    if (en == 0) {
        if (dev->mmap_write == NULL) {
            syslog(LOG_ERR, "mmap: can't disable disabled mmap gpio");
            return MRAA_ERROR_INVALID_PARAMETER;
        }
        dev->mmap_write = NULL;
        mmap_count--;
        if (mmap_count == 0) {
            return mraa_intel_galileo_g2_mmap_unsetup();
        }
        return MRAA_SUCCESS;
    }

    if (dev->mmap_write != NULL) {
        syslog(LOG_ERR, "mmap: can't enable enabled mmap gpio");
        return MRAA_ERROR_INVALID_PARAMETER;
    }
    if (mmap_reg == NULL) {
        if ((mmap_fd = open(UIO_PATH, O_RDWR)) < 0) {
            syslog(LOG_ERR, "mmap: Unable to open UIO device");
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        mmap_reg = mmap(NULL, mmap_size, PROT_READ | PROT_WRITE, MAP_SHARED, mmap_fd, 0);

        if (mmap_reg == MAP_FAILED) {
            syslog(LOG_ERR, "mmap: failed to mmap");
            mmap_reg = NULL;
            close(mmap_fd);
            return MRAA_ERROR_NO_RESOURCES;
        }
    }
    if (mraa_setup_mux_mapped(plat->pins[dev->phy_pin].mmap.gpio) != MRAA_SUCCESS) {
        syslog(LOG_ERR, "mmap: unable to setup required multiplexers");
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    dev->mmap_write = &mraa_intel_galileo_g2_mmap_write;
    return MRAA_SUCCESS;
}